

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O2

void __thiscall
Imf_3_2::Image::insertChannel
          (Image *this,string *name,PixelType type,int xSampling,int ySampling,bool pLinear)

{
  long lVar1;
  long *plVar2;
  mapped_type *pmVar3;
  long lVar4;
  long lVar5;
  int x;
  long lVar6;
  
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
           ::operator[](&this->_channels,name);
  pmVar3->type = type;
  pmVar3->xSampling = xSampling;
  pmVar3->ySampling = ySampling;
  pmVar3->pLinear = pLinear;
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < (this->_levels)._sizeX; lVar4 = lVar4 + 1) {
    for (lVar6 = 0; lVar1 = (this->_levels)._sizeY, lVar6 < lVar1; lVar6 = lVar6 + 1) {
      plVar2 = *(long **)((long)(this->_levels)._data + lVar6 * 8 + lVar1 * lVar5);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x20))(plVar2,name,type,xSampling,ySampling,pLinear);
      }
    }
    lVar5 = lVar5 + 8;
  }
  return;
}

Assistant:

void
Image::insertChannel (
    const std::string& name,
    PixelType          type,
    int                xSampling,
    int                ySampling,
    bool               pLinear)
{
    try
    {
        _channels[name] = ChannelInfo (type, xSampling, ySampling, pLinear);

        for (int y = 0; y < _levels.height (); ++y)
            for (int x = 0; x < _levels.width (); ++x)
                if (_levels[y][x])
                    _levels[y][x]->insertChannel (
                        name, type, xSampling, ySampling, pLinear);
    }
    catch (...)
    {
        eraseChannel (name);
        throw;
    }
}